

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O2

void basic_test(void)

{
  filemgr *file;
  filemgr_ops *ops;
  btree_blk_ops *pbVar1;
  btree_kv_ops *pbVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  filemgr_open_result fVar5;
  uint64_t v;
  uint64_t k;
  filemgr *local_190;
  timeval __test_begin;
  btree btree;
  btreeblk_handle btree_handle;
  btree btree2;
  filemgr_config local_90;
  
  uVar4 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  btreeblock_testfile");
  local_90.flag = 0;
  local_90.chunksize = 0;
  local_90.prefetch_duration = 0;
  local_90.encryption_key.bytes[0] = '\0';
  local_90.encryption_key.bytes[1] = '\0';
  local_90.encryption_key.bytes[2] = '\0';
  local_90.encryption_key.bytes[3] = '\0';
  local_90.encryption_key.bytes[4] = '\0';
  local_90.encryption_key.bytes[5] = '\0';
  local_90.encryption_key.bytes[6] = '\0';
  local_90.encryption_key.bytes[7] = '\0';
  local_90.encryption_key.bytes[8] = '\0';
  local_90.encryption_key.bytes[9] = '\0';
  local_90.encryption_key.bytes[10] = '\0';
  local_90.encryption_key.bytes[0xb] = '\0';
  local_90.encryption_key.bytes[0xc] = '\0';
  local_90.encryption_key.bytes[0xd] = '\0';
  local_90.encryption_key.bytes[0xe] = '\0';
  local_90.encryption_key.bytes[0xf] = '\0';
  local_90.encryption_key.bytes[0x10] = '\0';
  local_90.encryption_key.bytes[0x11] = '\0';
  local_90.encryption_key.bytes[0x12] = '\0';
  local_90.encryption_key.bytes[0x13] = '\0';
  local_90.encryption_key.bytes[0x14] = '\0';
  local_90.encryption_key.bytes[0x15] = '\0';
  local_90.encryption_key.bytes[0x16] = '\0';
  local_90.encryption_key.bytes[0x17] = '\0';
  local_90.encryption_key.bytes[0x18] = '\0';
  local_90.encryption_key.bytes[0x19] = '\0';
  local_90.encryption_key.bytes[0x1a] = '\0';
  local_90.encryption_key.bytes[0x1b] = '\0';
  local_90.encryption_key.bytes[0x1c] = '\0';
  local_90.encryption_key.bytes[0x1d] = '\0';
  local_90.encryption_key.bytes[0x1e] = '\0';
  local_90.encryption_key.bytes[0x1f] = '\0';
  local_90.do_not_cache_doc_blocks = false;
  local_90._89_3_ = 0;
  local_90.num_blocks_readahead = 0;
  local_90.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_90.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_90.blocksize = 0xa0;
  local_90.ncacheblock = 0;
  local_90.options = '\b';
  local_90.seqtree_opt = '\0';
  local_90._18_6_ = 0;
  local_90.num_wal_shards = 8;
  local_90.num_bcache_shards = 0;
  local_90.encryption_key.algorithm = 0;
  system("rm -rf  btreeblock_testfile");
  ops = get_filemgr_ops();
  fVar5 = filemgr_open("./btreeblock_testfile",ops,&local_90,(err_log_callback *)0x0);
  local_190 = fVar5.file;
  btreeblk_init(&btree_handle,local_190,0x50);
  pbVar1 = btreeblk_get_ops();
  pbVar2 = btree_kv_get_ku64_vu64();
  btree_init(&btree,&btree_handle,pbVar1,pbVar2,0x50,'\b','\b',0,(btree_meta *)0x0);
  for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
    v = uVar4;
    k = uVar3;
    btree_insert(&btree,&k,&v);
    uVar4 = uVar4 + 10;
  }
  btree_print_node(&btree,print_btree);
  uVar3 = 6;
  for (uVar4 = 0x3c; uVar4 != 0x78; uVar4 = uVar4 + 10) {
    v = uVar4;
    k = uVar3;
    btree_insert(&btree,&k,&v);
    uVar3 = uVar3 + 1;
  }
  btree_print_node(&btree,print_btree);
  btreeblk_end(&btree_handle);
  k = 4;
  v = 0x2c;
  btree_insert(&btree,&k,&v);
  btree_print_node(&btree,print_btree);
  btreeblk_end(&btree_handle);
  file = local_190;
  filemgr_commit(local_190,true,(err_log_callback *)0x0);
  k = 5;
  v = 0x37;
  btree_insert(&btree,&k,&v);
  btree_print_node(&btree,print_btree);
  btreeblk_end(&btree_handle);
  filemgr_commit(file,true,(err_log_callback *)0x0);
  k = 5;
  v = 0x3b;
  btree_insert(&btree,&k,&v);
  btree_print_node(&btree,print_btree);
  btreeblk_end(&btree_handle);
  filemgr_commit(file,true,(err_log_callback *)0x0);
  printf("re-read using root bid %lu\n",btree.root_bid);
  pbVar1 = btreeblk_get_ops();
  pbVar2 = btree_kv_get_ku64_vu64();
  btree_init_from_bid(&btree2,&btree_handle,pbVar1,pbVar2,0x50,btree.root_bid);
  btree_print_node(&btree2,print_btree);
  btreeblk_free(&btree_handle);
  filemgr_close(file,true,(char *)0x0,(err_log_callback *)0x0);
  filemgr_shutdown();
  fprintf(_stderr,"%s PASSED\n","basic test");
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    int ksize = 8;
    int vsize = 8;
    int nodesize = (ksize + vsize)*4 + sizeof(struct bnode);
    int blocksize = nodesize * 2;
    struct filemgr *file;
    struct btreeblk_handle btree_handle;
    struct btree btree;
    struct filemgr_config config;
    int i, r;
    uint64_t k,v;
    char *fname = (char *) "./btreeblock_testfile";

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;
    btreeblk_init(&btree_handle, file, nodesize);

    btree_init(&btree, (void*)&btree_handle, btreeblk_get_ops(),
               btree_kv_get_ku64_vu64(), nodesize, ksize, vsize, 0x0, NULL);

    for (i=0;i<6;++i) {
        k = i; v = i*10;
        btree_insert(&btree, (void*)&k, (void*)&v);
    }

    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    for (i=6;i<12;++i) {
        k = i; v = i*10;
        btree_insert(&btree, (void*)&k, (void*)&v);
    }

    btree_print_node(&btree, print_btree);
    btreeblk_end(&btree_handle);
    //btree_operation_end(&btree);

    k = 4;
    v = 44;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);

    k = 5;
    v = 55;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);

    k = 5;
    v = 59;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);


    struct btree btree2;

    DBG("re-read using root bid %" _F64 "\n", btree.root_bid);
    btree_init_from_bid(&btree2, (void*)&btree_handle, btreeblk_get_ops(),
                        btree_kv_get_ku64_vu64(), nodesize, btree.root_bid);
    btree_print_node(&btree2, print_btree);

    btreeblk_free(&btree_handle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("basic test");
}